

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerGLSL::remove_unity_swizzle(CompilerGLSL *this,uint32_t base,string *op)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  ulong uVar4;
  SPIRType *pSVar5;
  size_type sVar6;
  string final_swiz;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar4 = ::std::__cxx11::string::rfind((char)op,0x2e);
  if (uVar4 + 1 < 2) {
    return false;
  }
  ::std::__cxx11::string::substr((ulong)&final_swiz,(ulong)op);
  if ((this->backend).swizzle_is_function == true) {
    if (final_swiz._M_string_length < 2) goto LAB_002a18d5;
    ::std::__cxx11::string::substr((ulong)&local_50,(ulong)&final_swiz);
    bVar3 = ::std::operator==(&local_50,"()");
    ::std::__cxx11::string::~string((string *)&local_50);
    if (!bVar3) goto LAB_002a18d5;
    ::std::__cxx11::string::erase((ulong)&final_swiz,final_swiz._M_string_length - 2);
  }
  sVar6 = 0;
  do {
    if (final_swiz._M_string_length == sVar6) {
      pSVar5 = Compiler::expression_type(&this->super_Compiler,base);
      if ((pSVar5->columns != 1) ||
         ((pSVar5->array).super_VectorView<unsigned_int>.buffer_size != 0)) {
        __assert_fail("type.columns == 1 && type.array.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_glsl.cpp"
                      ,0x2d57,
                      "bool spirv_cross::CompilerGLSL::remove_unity_swizzle(uint32_t, string &)");
      }
      bVar3 = true;
      if (final_swiz._M_string_length == pSVar5->vecsize) {
        ::std::__cxx11::string::erase((ulong)op,uVar4);
      }
      goto LAB_002a18d7;
    }
  } while ((sVar6 != 4) &&
          (pcVar1 = final_swiz._M_dataplus._M_p + sVar6, pcVar2 = "xyzw" + sVar6, sVar6 = sVar6 + 1,
          *pcVar1 == *pcVar2));
LAB_002a18d5:
  bVar3 = false;
LAB_002a18d7:
  ::std::__cxx11::string::~string((string *)&final_swiz);
  return bVar3;
}

Assistant:

bool CompilerGLSL::remove_unity_swizzle(uint32_t base, string &op)
{
	auto pos = op.find_last_of('.');
	if (pos == string::npos || pos == 0)
		return false;

	string final_swiz = op.substr(pos + 1, string::npos);

	if (backend.swizzle_is_function)
	{
		if (final_swiz.size() < 2)
			return false;

		if (final_swiz.substr(final_swiz.size() - 2, string::npos) == "()")
			final_swiz.erase(final_swiz.size() - 2, string::npos);
		else
			return false;
	}

	// Check if final swizzle is of form .x, .xy, .xyz, .xyzw or similar.
	// If so, and previous swizzle is of same length,
	// we can drop the final swizzle altogether.
	for (uint32_t i = 0; i < final_swiz.size(); i++)
	{
		static const char expected[] = { 'x', 'y', 'z', 'w' };
		if (i >= 4 || final_swiz[i] != expected[i])
			return false;
	}

	auto &type = expression_type(base);

	// Sanity checking ...
	assert(type.columns == 1 && type.array.empty());

	if (type.vecsize == final_swiz.size())
		op.erase(pos, string::npos);
	return true;
}